

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O3

exr_result_t unpack_sample_table(exr_const_context_t ctxt,exr_decode_pipeline_t *decode)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  exr_result_t eVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int32_t *piVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int32_t *piVar14;
  bool bVar15;
  
  uVar1 = (decode->chunk).width;
  uVar2 = (decode->chunk).height;
  uVar8 = (ulong)uVar2;
  if ((long)decode->channel_count < 1) {
    lVar5 = 0;
  }
  else {
    lVar11 = 0;
    lVar5 = 0;
    do {
      lVar5 = lVar5 + (&decode->channels->bytes_per_element)[lVar11];
      lVar11 = lVar11 + 0x30;
    } while ((long)decode->channel_count * 0x30 != lVar11);
  }
  piVar9 = decode->sample_count_table;
  if ((decode->decode_flags & 1) == 0) {
    if ((int)uVar2 < 1) {
      uVar10 = 0;
    }
    else {
      bVar15 = true;
      uVar6 = 0;
      uVar10 = 0;
      do {
        if ((int)uVar1 < 1) {
          uVar12 = 0;
        }
        else {
          uVar13 = 0;
          uVar7 = 0;
          do {
            uVar12 = (ulong)(uint)piVar9[uVar13];
            if (piVar9[uVar13] < (int)uVar7) goto LAB_0012e647;
            uVar13 = uVar13 + 1;
            uVar7 = uVar12;
          } while (uVar1 != uVar13);
        }
        uVar10 = uVar10 + uVar12;
        uVar6 = uVar6 + 1;
        bVar15 = uVar6 < uVar8;
        piVar9 = piVar9 + (int)uVar1;
      } while (uVar6 != uVar8);
    }
    bVar15 = false;
LAB_0012e647:
    if (bVar15) {
      return 0x1f;
    }
    if (0x7ffffffe < uVar10) {
      return 0x1f;
    }
  }
  else {
    if ((int)uVar2 < 1) {
      uVar10 = 0;
      bVar15 = false;
    }
    else {
      bVar15 = true;
      uVar6 = 0;
      uVar10 = 0;
      piVar14 = piVar9;
      do {
        if ((int)uVar1 < 1) {
          uVar12 = 0;
        }
        else {
          uVar13 = 0;
          uVar7 = 0;
          do {
            uVar3 = piVar14[uVar13];
            uVar12 = (ulong)uVar3;
            if ((int)uVar3 < (int)uVar7) goto LAB_0012e662;
            piVar14[uVar13] = uVar3 - (int)uVar7;
            uVar13 = uVar13 + 1;
            uVar7 = uVar12;
          } while (uVar1 != uVar13);
        }
        uVar10 = uVar10 + uVar12;
        uVar6 = uVar6 + 1;
        bVar15 = uVar6 < uVar8;
        piVar14 = piVar14 + (int)uVar1;
      } while (uVar6 != uVar8);
      bVar15 = false;
    }
LAB_0012e662:
    if (bVar15) {
      return 0x1f;
    }
    if (0x7ffffffe < uVar10) {
      return 0x1f;
    }
    piVar9[(int)(uVar1 * uVar2)] = (int32_t)uVar10;
  }
  uVar8 = (decode->chunk).unpacked_size;
  if (uVar10 * lVar5 < uVar8 || uVar10 * lVar5 - uVar8 == 0) {
    return 0;
  }
  eVar4 = (*ctxt->report_error)(ctxt,0x1f,"Corrupt sample count table");
  return eVar4;
}

Assistant:

static exr_result_t
unpack_sample_table (exr_const_context_t ctxt, exr_decode_pipeline_t* decode)
{
    exr_result_t rv           = EXR_ERR_SUCCESS;
    int32_t      w            = decode->chunk.width;
    int32_t      h            = decode->chunk.height;
    uint64_t     totsamp      = 0;
    int32_t*     samptable    = decode->sample_count_table;
    size_t       combSampSize = 0;

    for (int c = 0; c < decode->channel_count; ++c)
        combSampSize += ((size_t) decode->channels[c].bytes_per_element);

    if ((decode->decode_flags & EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
    {
        for (int32_t y = 0; y < h; ++y)
        {
            int32_t* cursampline = samptable + y * w;
            int32_t  prevsamp    = 0;
            for (int32_t x = 0; x < w; ++x)
            {
                int32_t nsamps =
                    (int32_t) one_to_native32 ((uint32_t) cursampline[x]);
                // not monotonic, violation
                if (nsamps < prevsamp) return EXR_ERR_INVALID_SAMPLE_DATA;
                cursampline[x] = nsamps - prevsamp;
                prevsamp       = nsamps;
            }
            totsamp += (uint64_t) prevsamp;
        }
        if (totsamp >= (uint64_t) INT32_MAX) return EXR_ERR_INVALID_SAMPLE_DATA;
        samptable[w * h] = (int32_t) totsamp;
    }
    else
    {
        for (int32_t y = 0; y < h; ++y)
        {
            int32_t* cursampline = samptable + y * w;
            int32_t  prevsamp    = 0;
            for (int32_t x = 0; x < w; ++x)
            {
                int32_t nsamps =
                    (int32_t) one_to_native32 ((uint32_t) cursampline[x]);
                // not monotonic, violation
                if (nsamps < prevsamp) return EXR_ERR_INVALID_SAMPLE_DATA;

                cursampline[x] = nsamps;
                prevsamp       = nsamps;
            }

            totsamp += (uint64_t) prevsamp;
        }
        if (totsamp >= (uint64_t) INT32_MAX) return EXR_ERR_INVALID_SAMPLE_DATA;
    }

    if ((totsamp * combSampSize) > decode->chunk.unpacked_size)
    {
        rv = ctxt->report_error (
            ctxt, EXR_ERR_INVALID_SAMPLE_DATA, "Corrupt sample count table");
    }

    return rv;
}